

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O1

S2Point * __thiscall S2PaddedCell::GetCenter(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int iVar1;
  double dVar2;
  S2Point local_28;
  
  iVar1 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  S2::FaceSiTitoXYZ(&local_28,(uint)((this->id_).id_ >> 0x3d),iVar1 + this->ij_lo_[0] * 2,
                    iVar1 + this->ij_lo_[1] * 2);
  dVar2 = local_28.c_[2] * local_28.c_[2] +
          local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  __return_storage_ptr__->c_[0] = local_28.c_[0] * dVar2;
  __return_storage_ptr__->c_[1] = local_28.c_[1] * dVar2;
  __return_storage_ptr__->c_[2] = dVar2 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetCenter() const {
  int ij_size = S2CellId::GetSizeIJ(level_);
  unsigned int si = 2 * ij_lo_[0] + ij_size;
  unsigned int ti = 2 * ij_lo_[1] + ij_size;
  return S2::FaceSiTitoXYZ(id_.face(), si, ti).Normalize();
}